

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::close_oldest
          (file_pool_impl<libtorrent::aux::file_pool_entry> *this)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  size_traits local_18;
  
  local_30._M_device = &this->m_mutex;
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  remove_oldest((file_pool_impl<libtorrent::aux::file_pool_entry> *)&stack0xffffffffffffffe0,
                (unique_lock<std::mutex> *)this);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18.size_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18.size_);
  }
  return;
}

Assistant:

void file_pool_impl<FileEntry>::close_oldest()
	{
		// closing a file may be long running operation (mac os x)
		// destruct it after the mutex is released
		FileHandle deferred_destruction;

		std::unique_lock<std::mutex> l(m_mutex);
		deferred_destruction = remove_oldest(l);
	}